

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O3

int __thiscall CCNR::ls_solver::pick_var(ls_solver *this)

{
  int *piVar1;
  pointer pvVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pcVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  iterator __begin2;
  int *piVar10;
  undefined8 *puVar11;
  iterator __end2;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  
  piVar10 = (this->_ccd_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar1 = (this->_ccd_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar8 = (long)piVar1 - (long)piVar10;
  if (lVar8 == 0) {
    if (this->_aspiration_active == true) {
      piVar3 = (this->_unsat_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar4 = (this->_unsat_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar12 = (long)piVar4 - (long)piVar3 >> 2;
      this->_aspiration_score = this->_avg_clause_weight;
      if (piVar4 == piVar3) {
        uVar15 = 0;
        uVar13 = 1;
      }
      else {
        lVar16 = uVar12 + (uVar12 == 0);
        lVar8 = 0;
        do {
          uVar15 = (ulong)piVar3[lVar8];
          if ((long)this->_avg_clause_weight <
              (this->_vars).super__Vector_base<CCNR::variable,_std::allocator<CCNR::variable>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar15].score) goto LAB_0012cd1e;
          lVar8 = lVar8 + 1;
        } while (lVar16 != lVar8);
        uVar15 = 0;
        lVar8 = lVar16;
LAB_0012cd1e:
        uVar13 = lVar8 + 1;
      }
      if (uVar13 < uVar12) {
        pvVar2 = (this->_vars).super__Vector_base<CCNR::variable,_std::allocator<CCNR::variable>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        do {
          uVar9 = (ulong)piVar3[uVar13];
          if ((pvVar2[uVar9].score <= pvVar2[(int)uVar15].score) &&
             ((pvVar2[uVar9].score != pvVar2[(int)uVar15].score ||
              (pvVar2[(int)uVar15].last_flip_step <= pvVar2[uVar9].last_flip_step)))) {
            uVar9 = uVar15 & 0xffffffff;
          }
          iVar14 = (int)uVar9;
          uVar13 = uVar13 + 1;
          uVar15 = uVar9 & 0xffffffff;
        } while (uVar12 != uVar13);
      }
      else {
        iVar14 = (int)uVar15;
      }
      if (iVar14 != 0) {
        return iVar14;
      }
    }
    update_clause_weights(this);
    uVar12 = (ulong)((long)(this->_unsat_clauses).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->_unsat_clauses).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 2;
    do {
      uVar6 = Mersenne::next32(&this->_random_gen);
    } while ((int)((uVar6 >> 1) + (int)uVar12) < 0);
    pcVar5 = (this->_clauses).super__Vector_base<CCNR::clause,_std::allocator<CCNR::clause>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar7 = (this->_unsat_clauses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(ulong)(uVar6 >> 1) % (uVar12 & 0xffffffff)];
    lVar8 = *(long *)&pcVar5[iVar7].literals.
                      super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl;
    iVar14 = *(int *)(lVar8 + 8);
    uVar6 = (uint)((ulong)((long)*(pointer *)
                                  ((long)&pcVar5[iVar7].literals.
                                          super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>.
                                          _M_impl + 8) - lVar8) >> 4);
    if (1 < (int)uVar6) {
      pvVar2 = (this->_vars).super__Vector_base<CCNR::variable,_std::allocator<CCNR::variable>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar11 = (undefined8 *)(lVar8 + 0x18);
      lVar8 = (ulong)(uVar6 & 0x7fffffff) - 1;
      do {
        iVar7 = (int)*puVar11;
        if ((pvVar2[iVar7].score <= pvVar2[iVar14].score) &&
           ((pvVar2[iVar7].score != pvVar2[iVar14].score ||
            (pvVar2[iVar14].last_flip_step <= pvVar2[iVar7].last_flip_step)))) {
          iVar7 = iVar14;
        }
        iVar14 = iVar7;
        puVar11 = puVar11 + 2;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
  }
  else {
    this->_mems = this->_mems + (lVar8 >> 2);
    iVar14 = *piVar10;
    pvVar2 = (this->_vars).super__Vector_base<CCNR::variable,_std::allocator<CCNR::variable>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      iVar7 = *piVar10;
      if ((pvVar2[iVar7].score <= pvVar2[iVar14].score) &&
         ((pvVar2[iVar7].score != pvVar2[iVar14].score ||
          (pvVar2[iVar14].last_flip_step <= pvVar2[iVar7].last_flip_step)))) {
        iVar7 = iVar14;
      }
      iVar14 = iVar7;
      piVar10 = piVar10 + 1;
    } while (piVar10 != piVar1);
  }
  return iVar14;
}

Assistant:

int ls_solver::pick_var()
{
    size_t i;
    int k, c, v;
    int best_var = 0;

    // if(_random_gen.nextClosed() < _prob_p){
    // 	c = _unsat_clauses[_random_gen.next(_unsat_clauses.size())];
    // 	clause * cp = &(_clauses[c]);
    // 	return cp->literals[_random_gen.next(cp->literals.size())].var_num;
    // }


    if (_ccd_vars.size() > 0) {
        _mems += _ccd_vars.size();
        best_var = _ccd_vars[0];
        for (int v : _ccd_vars) {
            if (_vars[v].score > _vars[best_var].score) {
                best_var = v;
            } else if (_vars[v].score == _vars[best_var].score && _vars[v].last_flip_step < _vars[best_var].last_flip_step) {
                best_var = v;
            }
        }
        return best_var;
    }

    // Aspriation Mode

    //----------------------------------------
    if (_aspiration_active) {
        // if(_random_gen.nextClosed() < _prob_p){
        // 	c = _unsat_clauses[_random_gen.next(_unsat_clauses.size())];
        // 	clause * cp = &(_clauses[c]);
        // 	return cp->literals[_random_gen.next(cp->literals.size())].var_num;
        // }

        _aspiration_score = _avg_clause_weight;
        for (i = 0; i < _unsat_vars.size(); ++i) {
            v = _unsat_vars[i];
            if (_vars[v].score > _aspiration_score) {
                best_var = v;
                break;
            }
        }
        for (++i; i < _unsat_vars.size(); ++i) {
            v = _unsat_vars[i];
            if (_vars[v].score > _vars[best_var].score)
                best_var = v;
            else if (_vars[v].score == _vars[best_var].score && _vars[v].last_flip_step < _vars[best_var].last_flip_step)
                best_var = v;
        }
        if (best_var != 0) return best_var;
    }
    //=========================================


    /**Diversification Mode**/
    update_clause_weights();

    /*focused random walk*/
    c = _unsat_clauses[_random_gen.next(_unsat_clauses.size())];
    clause *cp = &(_clauses[c]);
    best_var = cp->literals[0].var_num;
    int cp_lits_sz = cp->literals.size();
    for (k = 1; k < cp_lits_sz; k++) {
        v = cp->literals[k].var_num;
        if (_vars[v].score > _vars[best_var].score) {
            best_var = v;
        } else if (_vars[v].score == _vars[best_var].score && _vars[v].last_flip_step < _vars[best_var].last_flip_step) {
            best_var = v;
        }
    }
    return best_var;
}